

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::dynamicCheckTestMessageAllZero<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  bool bVar1;
  BuilderFor<bool> BVar2;
  BuilderFor<signed_char> BVar3;
  BuilderFor<unsigned_char> BVar4;
  BuilderFor<short> BVar5;
  BuilderFor<unsigned_short> BVar6;
  BuilderFor<int> BVar7;
  BuilderFor<unsigned_int> BVar8;
  uint uVar9;
  BuilderFor<long> BVar10;
  BuilderFor<unsigned_long> BVar11;
  BuilderFor<float> BVar12;
  BuilderFor<double> BVar13;
  ArrayPtr<unsigned_char> AVar14;
  ArrayPtr<const_char> local_3990;
  Builder local_3980;
  BuilderFor<capnp::DynamicList> local_3940;
  uint local_3904;
  uint local_3900;
  bool local_38f9;
  undefined1 auStack_38f8 [7];
  bool _kj_shouldLog_59;
  Builder local_38e8;
  BuilderFor<capnp::DynamicList> local_38a8;
  ArrayPtr<const_char> local_3870;
  Builder local_3860;
  BuilderFor<capnp::DynamicList> local_3820;
  uint local_37e4;
  uint local_37e0;
  bool local_37d9;
  undefined1 auStack_37d8 [7];
  bool _kj_shouldLog_58;
  Builder local_37c8;
  BuilderFor<capnp::DynamicList> local_3788;
  ArrayPtr<const_char> local_3750;
  Builder local_3740;
  BuilderFor<capnp::DynamicList> local_3700;
  uint local_36c4;
  uint local_36c0;
  bool local_36b9;
  undefined1 auStack_36b8 [7];
  bool _kj_shouldLog_57;
  Builder local_36a8;
  BuilderFor<capnp::DynamicList> local_3668;
  ArrayPtr<const_char> local_3630;
  Builder local_3620;
  BuilderFor<capnp::DynamicList> local_35e0;
  uint local_35a4;
  uint local_35a0;
  bool local_3599;
  undefined1 auStack_3598 [7];
  bool _kj_shouldLog_56;
  Builder local_3588;
  BuilderFor<capnp::DynamicList> local_3548;
  ArrayPtr<const_char> local_3510;
  Builder local_3500;
  BuilderFor<capnp::DynamicList> local_34c0;
  uint local_3484;
  uint local_3480;
  bool local_3479;
  undefined1 auStack_3478 [7];
  bool _kj_shouldLog_55;
  Builder local_3468;
  BuilderFor<capnp::DynamicList> local_3428;
  ArrayPtr<const_char> local_33f0;
  Builder local_33e0;
  BuilderFor<capnp::DynamicList> local_33a0;
  uint local_3364;
  uint local_3360;
  bool local_3359;
  undefined1 auStack_3358 [7];
  bool _kj_shouldLog_54;
  Builder local_3348;
  BuilderFor<capnp::DynamicList> local_3308;
  ArrayPtr<const_char> local_32d0;
  Builder local_32c0;
  BuilderFor<capnp::DynamicList> local_3280;
  uint local_3244;
  uint local_3240;
  bool local_3239;
  undefined1 auStack_3238 [7];
  bool _kj_shouldLog_53;
  Builder local_3228;
  BuilderFor<capnp::DynamicList> local_31e8;
  ArrayPtr<const_char> local_31b0;
  Builder local_31a0;
  BuilderFor<capnp::DynamicList> local_3160;
  uint local_3124;
  uint local_3120;
  bool local_3119;
  undefined1 auStack_3118 [7];
  bool _kj_shouldLog_52;
  Builder local_3108;
  BuilderFor<capnp::DynamicList> local_30c8;
  ArrayPtr<const_char> local_3090;
  Builder local_3080;
  BuilderFor<capnp::DynamicList> local_3040;
  uint local_3004;
  uint local_3000;
  bool local_2ff9;
  undefined1 auStack_2ff8 [7];
  bool _kj_shouldLog_51;
  Builder local_2fe8;
  BuilderFor<capnp::DynamicList> local_2fa8;
  ArrayPtr<const_char> local_2f70;
  Builder local_2f60;
  BuilderFor<capnp::DynamicList> local_2f20;
  uint local_2ee4;
  uint local_2ee0;
  bool local_2ed9;
  undefined1 auStack_2ed8 [7];
  bool _kj_shouldLog_50;
  Builder local_2ec8;
  BuilderFor<capnp::DynamicList> local_2e88;
  ArrayPtr<const_char> local_2e50;
  Builder local_2e40;
  BuilderFor<capnp::DynamicList> local_2e00;
  uint local_2dc4;
  uint local_2dc0;
  bool local_2db9;
  undefined1 auStack_2db8 [7];
  bool _kj_shouldLog_49;
  Builder local_2da8;
  BuilderFor<capnp::DynamicList> local_2d68;
  ArrayPtr<const_char> local_2d30;
  Builder local_2d20;
  BuilderFor<capnp::DynamicList> local_2ce0;
  uint local_2ca4;
  uint local_2ca0;
  bool local_2c99;
  undefined1 auStack_2c98 [7];
  bool _kj_shouldLog_48;
  Builder local_2c88;
  BuilderFor<capnp::DynamicList> local_2c48;
  ArrayPtr<const_char> local_2c10;
  Builder local_2c00;
  BuilderFor<capnp::DynamicList> local_2bc0;
  uint local_2b84;
  uint local_2b80;
  bool local_2b79;
  undefined1 auStack_2b78 [7];
  bool _kj_shouldLog_47;
  Builder local_2b68;
  BuilderFor<capnp::DynamicList> local_2b28;
  ArrayPtr<const_char> local_2af0;
  Builder local_2ae0;
  BuilderFor<capnp::DynamicList> local_2aa0;
  uint local_2a64;
  uint local_2a60;
  bool local_2a59;
  undefined1 auStack_2a58 [7];
  bool _kj_shouldLog_46;
  Builder local_2a48;
  BuilderFor<capnp::DynamicList> local_2a08;
  ArrayPtr<const_char> local_29d0;
  Builder local_29c0;
  BuilderFor<capnp::DynamicList> local_2980;
  uint local_2944;
  uint local_2940;
  bool local_2939;
  undefined1 auStack_2938 [7];
  bool _kj_shouldLog_45;
  Builder local_2928;
  BuilderFor<capnp::DynamicList> local_28e8;
  ArrayPtr<const_char> local_28b0;
  Builder local_28a0;
  BuilderFor<capnp::DynamicList> local_2860;
  uint local_2824;
  uint local_2820;
  bool local_2819;
  undefined1 auStack_2818 [7];
  bool _kj_shouldLog_44;
  Builder local_2808;
  BuilderFor<capnp::DynamicList> local_27c8;
  ArrayPtr<const_char> local_2790;
  Builder local_2780;
  BuilderFor<capnp::DynamicList> local_2740;
  uint local_2704;
  uint local_2700;
  bool local_26f9;
  undefined1 auStack_26f8 [7];
  bool _kj_shouldLog_43;
  Builder local_26e8;
  BuilderFor<capnp::DynamicList> local_26a8;
  ArrayPtr<const_char> local_2670;
  Builder local_2660;
  BuilderFor<capnp::DynamicList> local_2620;
  uint local_25e4;
  uint local_25e0;
  bool local_25d9;
  undefined1 auStack_25d8 [7];
  bool _kj_shouldLog_42;
  Builder local_25c8;
  BuilderFor<capnp::DynamicList> local_2588;
  ArrayPtr<const_char> local_2550;
  Builder local_2540;
  BuilderFor<capnp::DynamicList> local_2500;
  uint local_24c4;
  uint local_24c0;
  bool local_24b9;
  undefined1 auStack_24b8 [7];
  bool _kj_shouldLog_41;
  Builder local_24a8;
  BuilderFor<capnp::DynamicList> local_2468;
  ArrayPtr<const_char> local_2430;
  Builder local_2420;
  BuilderFor<capnp::DynamicList> local_23e0;
  uint local_23a4;
  uint local_23a0;
  bool local_2399;
  undefined1 auStack_2398 [7];
  bool _kj_shouldLog_40;
  Builder local_2388;
  BuilderFor<capnp::DynamicList> local_2348;
  ArrayPtr<const_char> local_2310;
  Builder local_2300;
  BuilderFor<capnp::DynamicList> local_22c0;
  uint local_2284;
  uint local_2280;
  bool local_2279;
  undefined1 auStack_2278 [7];
  bool _kj_shouldLog_39;
  Builder local_2268;
  BuilderFor<capnp::DynamicList> local_2228;
  ArrayPtr<const_char> local_21f0;
  Builder local_21e0;
  BuilderFor<capnp::DynamicList> local_21a0;
  uint local_2164;
  uint local_2160;
  bool local_2159;
  undefined1 auStack_2158 [7];
  bool _kj_shouldLog_38;
  Builder local_2148;
  BuilderFor<capnp::DynamicList> local_2108;
  ArrayPtr<const_char> local_20d0;
  Builder local_20c0;
  BuilderFor<capnp::DynamicList> local_2080;
  uint local_2044;
  uint local_2040;
  bool local_2039;
  undefined1 auStack_2038 [7];
  bool _kj_shouldLog_37;
  Builder local_2028;
  BuilderFor<capnp::DynamicList> local_1fe8;
  ArrayPtr<const_char> local_1fb0;
  Builder local_1fa0;
  BuilderFor<capnp::DynamicList> local_1f60;
  uint local_1f24;
  uint local_1f20;
  bool local_1f19;
  undefined1 auStack_1f18 [7];
  bool _kj_shouldLog_36;
  Builder local_1f08;
  BuilderFor<capnp::DynamicList> local_1ec8;
  ArrayPtr<const_char> local_1e90;
  Builder local_1e80;
  BuilderFor<capnp::DynamicList> local_1e40;
  uint local_1e04;
  uint local_1e00;
  bool local_1df9;
  undefined1 auStack_1df8 [7];
  bool _kj_shouldLog_35;
  Builder local_1de8;
  BuilderFor<capnp::DynamicList> local_1da8;
  ArrayPtr<const_char> local_1d70;
  Builder local_1d60;
  BuilderFor<capnp::DynamicList> local_1d20;
  uint local_1ce4;
  uint local_1ce0;
  bool local_1cd9;
  undefined1 auStack_1cd8 [7];
  bool _kj_shouldLog_34;
  Builder local_1cc8;
  BuilderFor<capnp::DynamicList> local_1c88;
  ArrayPtr<const_char> local_1c50;
  Builder local_1c40;
  BuilderFor<capnp::DynamicList> local_1c00;
  uint local_1bc4;
  uint local_1bc0;
  bool local_1bb9;
  undefined1 auStack_1bb8 [7];
  bool _kj_shouldLog_33;
  Builder local_1ba8;
  BuilderFor<capnp::DynamicList> local_1b68;
  ArrayPtr<const_char> local_1b30;
  Builder local_1b20;
  BuilderFor<capnp::DynamicList> local_1ae0;
  uint local_1aa4;
  uint local_1aa0;
  bool local_1a99;
  undefined1 auStack_1a98 [7];
  bool _kj_shouldLog_32;
  Builder local_1a88;
  BuilderFor<capnp::DynamicList> local_1a48;
  ArrayPtr<const_char> local_1a10;
  Builder local_1a00;
  BuilderFor<capnp::DynamicList> local_19c0;
  uint local_1984;
  uint local_1980;
  bool local_1979;
  undefined1 auStack_1978 [7];
  bool _kj_shouldLog_31;
  Builder local_1968;
  BuilderFor<capnp::DynamicList> local_1928;
  ArrayPtr<const_char> local_18f0;
  Builder local_18e0;
  BuilderFor<capnp::DynamicList> local_18a0;
  uint local_1864;
  uint local_1860;
  bool local_1859;
  undefined1 auStack_1858 [7];
  bool _kj_shouldLog_30;
  Builder local_1848;
  BuilderFor<capnp::DynamicList> local_1808;
  ArrayPtr<const_char> local_17d0;
  ArrayPtr<const_char> local_17c0;
  Builder local_17b0;
  BuilderFor<capnp::DynamicStruct> local_1770;
  Builder local_1740;
  BuilderFor<capnp::Text> local_1700;
  bool local_16e1;
  undefined1 auStack_16e0 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_16d0;
  Builder local_16c0;
  BuilderFor<capnp::DynamicStruct> local_1680;
  Builder local_1650;
  BuilderFor<capnp::Text> local_1610;
  ArrayPtr<const_char> local_15f8;
  Builder local_15e8;
  BuilderFor<capnp::Text> local_15a8;
  bool local_1589;
  undefined1 auStack_1588 [7];
  bool _kj_shouldLog_28;
  Builder local_1578;
  BuilderFor<capnp::Text> local_1538;
  ArrayPtr<const_char> local_1520;
  Builder local_1510;
  undefined1 local_14d0 [8];
  BuilderFor<capnp::DynamicStruct> subSubReader;
  Builder local_1490;
  ArrayPtr<unsigned_char> local_1450;
  ArrayPtr<const_unsigned_char> local_1440;
  bool local_1429;
  undefined1 auStack_1428 [7];
  bool _kj_shouldLog_27;
  Builder local_1418;
  ArrayPtr<unsigned_char> local_13d8;
  ArrayPtr<const_unsigned_char> local_13c8;
  ArrayPtr<const_char> local_13b8;
  Builder local_13a8;
  BuilderFor<capnp::Text> local_1368;
  bool local_1349;
  undefined1 auStack_1348 [7];
  bool _kj_shouldLog_26;
  Builder local_1338;
  BuilderFor<capnp::Text> local_12f8;
  int local_12dc;
  ArrayPtr<const_char> local_12d8;
  Builder local_12c8;
  BuilderFor<double> local_1288;
  bool local_1279;
  undefined1 auStack_1278 [7];
  bool _kj_shouldLog_25;
  Builder local_1268;
  int local_1224;
  ArrayPtr<const_char> local_1220;
  Builder local_1210;
  BuilderFor<float> local_11d0;
  bool local_11c9;
  undefined1 auStack_11c8 [7];
  bool _kj_shouldLog_24;
  Builder local_11b8;
  ArrayPtr<const_char> local_1178;
  Builder local_1168;
  BuilderFor<unsigned_long> local_1128;
  uint local_1120;
  bool local_1119;
  undefined1 auStack_1118 [7];
  bool _kj_shouldLog_23;
  Builder local_1108;
  ArrayPtr<const_char> local_10c8;
  Builder local_10b8;
  BuilderFor<unsigned_int> local_1074;
  uint local_1070;
  bool local_1069;
  undefined1 auStack_1068 [7];
  bool _kj_shouldLog_22;
  Builder local_1058;
  ArrayPtr<const_char> local_1018;
  Builder local_1008;
  BuilderFor<unsigned_short> local_fc2;
  uint local_fc0;
  bool local_fb9;
  undefined1 auStack_fb8 [7];
  bool _kj_shouldLog_21;
  Builder local_fa8;
  ArrayPtr<const_char> local_f68;
  Builder local_f58;
  BuilderFor<unsigned_char> local_f11;
  uint local_f10;
  bool local_f09;
  undefined1 auStack_f08 [7];
  bool _kj_shouldLog_20;
  Builder local_ef8;
  ArrayPtr<const_char> local_eb8;
  Builder local_ea8;
  BuilderFor<long> local_e68;
  int local_e60;
  bool local_e59;
  undefined1 auStack_e58 [7];
  bool _kj_shouldLog_19;
  Builder local_e48;
  ArrayPtr<const_char> local_e08;
  Builder local_df8;
  BuilderFor<int> local_db4;
  int local_db0;
  bool local_da9;
  undefined1 auStack_da8 [7];
  bool _kj_shouldLog_18;
  Builder local_d98;
  ArrayPtr<const_char> local_d58;
  Builder local_d48;
  BuilderFor<short> local_d02;
  int local_d00;
  bool local_cf9;
  undefined1 auStack_cf8 [7];
  bool _kj_shouldLog_17;
  Builder local_ce8;
  ArrayPtr<const_char> local_ca8;
  Builder local_c98;
  BuilderFor<signed_char> local_c51;
  int local_c50;
  bool local_c49;
  undefined1 auStack_c48 [7];
  bool _kj_shouldLog_16;
  Builder local_c38;
  ArrayPtr<const_char> local_bf8;
  Builder local_be8;
  bool local_ba3;
  bool local_ba2;
  bool local_ba1;
  undefined1 auStack_ba0 [7];
  bool _kj_shouldLog_15;
  Builder local_b90;
  ArrayPtr<const_char> local_b48;
  Builder local_b38;
  Void local_af3;
  bool local_af2;
  undefined1 auStack_af0 [6];
  bool _kj_shouldLog_14;
  Builder local_ae0;
  ArrayPtr<const_char> local_a98;
  Builder local_a88;
  undefined1 local_a48 [8];
  BuilderFor<capnp::DynamicStruct> subReader;
  Builder local_a08;
  ArrayPtr<unsigned_char> local_9c8;
  ArrayPtr<const_unsigned_char> local_9b8;
  bool local_9a1;
  undefined1 auStack_9a0 [7];
  bool _kj_shouldLog_13;
  Builder local_990;
  ArrayPtr<unsigned_char> local_950;
  ArrayPtr<const_unsigned_char> local_940;
  ArrayPtr<const_char> local_930;
  Builder local_920;
  BuilderFor<capnp::Text> local_8e0;
  bool local_8c1;
  undefined1 auStack_8c0 [7];
  bool _kj_shouldLog_12;
  Builder local_8b0;
  BuilderFor<capnp::Text> local_870;
  int local_854;
  ArrayPtr<const_char> local_850;
  Builder local_840;
  BuilderFor<double> local_800;
  bool local_7f1;
  undefined1 auStack_7f0 [7];
  bool _kj_shouldLog_11;
  Builder local_7e0;
  int local_79c;
  ArrayPtr<const_char> local_798;
  Builder local_788;
  BuilderFor<float> local_748;
  bool local_741;
  undefined1 auStack_740 [7];
  bool _kj_shouldLog_10;
  Builder local_730;
  ArrayPtr<const_char> local_6f0;
  Builder local_6e0;
  BuilderFor<unsigned_long> local_6a0;
  uint local_698;
  bool local_691;
  undefined1 auStack_690 [7];
  bool _kj_shouldLog_9;
  Builder local_680;
  ArrayPtr<const_char> local_640;
  Builder local_630;
  BuilderFor<unsigned_int> local_5ec;
  uint local_5e8;
  bool local_5e1;
  undefined1 auStack_5e0 [7];
  bool _kj_shouldLog_8;
  Builder local_5d0;
  ArrayPtr<const_char> local_590;
  Builder local_580;
  BuilderFor<unsigned_short> local_53a;
  uint local_538;
  bool local_531;
  undefined1 auStack_530 [7];
  bool _kj_shouldLog_7;
  Builder local_520;
  ArrayPtr<const_char> local_4e0;
  Builder local_4d0;
  BuilderFor<unsigned_char> local_489;
  uint local_488;
  bool local_481;
  undefined1 auStack_480 [7];
  bool _kj_shouldLog_6;
  Builder local_470;
  ArrayPtr<const_char> local_430;
  Builder local_420;
  BuilderFor<long> local_3e0;
  int local_3d8;
  bool local_3d1;
  undefined1 auStack_3d0 [7];
  bool _kj_shouldLog_5;
  Builder local_3c0;
  ArrayPtr<const_char> local_380;
  Builder local_370;
  BuilderFor<int> local_32c;
  int local_328;
  bool local_321;
  undefined1 auStack_320 [7];
  bool _kj_shouldLog_4;
  Builder local_310;
  ArrayPtr<const_char> local_2d0;
  Builder local_2c0;
  BuilderFor<short> local_27a;
  int local_278;
  bool local_271;
  undefined1 auStack_270 [7];
  bool _kj_shouldLog_3;
  Builder local_260;
  ArrayPtr<const_char> local_220;
  Builder local_210;
  BuilderFor<signed_char> local_1c9;
  int local_1c8;
  bool local_1c1;
  undefined1 auStack_1c0 [7];
  bool _kj_shouldLog_2;
  Builder local_1b0;
  ArrayPtr<const_char> local_170;
  Builder local_160;
  bool local_11b;
  bool local_11a;
  bool local_119;
  undefined1 auStack_118 [7];
  bool _kj_shouldLog_1;
  Builder local_108;
  ArrayPtr<const_char> local_c0;
  Builder local_b0;
  Void local_6f;
  bool local_6e;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_60;
  Builder local_50;
  
  kj::StringPtr::StringPtr((StringPtr *)&local_60,"voidField");
  DynamicStruct::Builder::get(&local_50,(Builder *)&stack0x00000008,(StringPtr)local_60);
  DynamicValue::Builder::as<capnp::Void>(&local_50);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Builder::~Builder(&local_50);
  if (!bVar1) {
    local_6e = kj::_::Debug::shouldLog(ERROR);
    while (local_6e != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_c0,"voidField");
      DynamicStruct::Builder::get(&local_b0,(Builder *)&stack0x00000008,(StringPtr)local_c0);
      DynamicValue::Builder::as<capnp::Void>(&local_b0);
      kj::_::Debug::log<char_const(&)[73],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x20b,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", VOID, reader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [73])
                  "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
                 (Void *)&VOID,&local_6f);
      DynamicValue::Builder::~Builder(&local_b0);
      local_6e = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_118,"boolField");
  DynamicStruct::Builder::get(&local_108,(Builder *)&stack0x00000008,(StringPtr)_auStack_118);
  BVar2 = DynamicValue::Builder::as<bool>(&local_108);
  DynamicValue::Builder::~Builder(&local_108);
  if (BVar2) {
    local_119 = kj::_::Debug::shouldLog(ERROR);
    while (local_119 != false) {
      local_11a = false;
      kj::StringPtr::StringPtr((StringPtr *)&local_170,"boolField");
      DynamicStruct::Builder::get(&local_160,(Builder *)&stack0x00000008,(StringPtr)local_170);
      local_11b = DynamicValue::Builder::as<bool>(&local_160);
      kj::_::Debug::log<char_const(&)[74],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x20c,ERROR,
                 "\"failed: expected \" \"(false) == (reader.get(\\\"boolField\\\").template as<bool>())\", false, reader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [74])
                  "failed: expected (false) == (reader.get(\"boolField\").template as<bool>())",
                 &local_11a,&local_11b);
      DynamicValue::Builder::~Builder(&local_160);
      local_119 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1c0,"int8Field");
  DynamicStruct::Builder::get(&local_1b0,(Builder *)&stack0x00000008,(StringPtr)_auStack_1c0);
  BVar3 = DynamicValue::Builder::as<signed_char>(&local_1b0);
  DynamicValue::Builder::~Builder(&local_1b0);
  if (BVar3 != '\0') {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      local_1c8 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_220,"int8Field");
      DynamicStruct::Builder::get(&local_210,(Builder *)&stack0x00000008,(StringPtr)local_220);
      local_1c9 = DynamicValue::Builder::as<signed_char>(&local_210);
      kj::_::Debug::log<char_const(&)[72],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x20d,ERROR,
                 "\"failed: expected \" \"(0) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", 0, reader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [72])
                  "failed: expected (0) == (reader.get(\"int8Field\").template as<int8_t>())",
                 &local_1c8,&local_1c9);
      DynamicValue::Builder::~Builder(&local_210);
      local_1c1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_270,"int16Field");
  DynamicStruct::Builder::get(&local_260,(Builder *)&stack0x00000008,(StringPtr)_auStack_270);
  BVar5 = DynamicValue::Builder::as<short>(&local_260);
  DynamicValue::Builder::~Builder(&local_260);
  if (BVar5 != 0) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      local_278 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2d0,"int16Field");
      DynamicStruct::Builder::get(&local_2c0,(Builder *)&stack0x00000008,(StringPtr)local_2d0);
      local_27a = DynamicValue::Builder::as<short>(&local_2c0);
      kj::_::Debug::log<char_const(&)[74],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x20e,ERROR,
                 "\"failed: expected \" \"(0) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", 0, reader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [74])
                  "failed: expected (0) == (reader.get(\"int16Field\").template as<int16_t>())",
                 &local_278,&local_27a);
      DynamicValue::Builder::~Builder(&local_2c0);
      local_271 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_320,"int32Field");
  DynamicStruct::Builder::get(&local_310,(Builder *)&stack0x00000008,(StringPtr)_auStack_320);
  BVar7 = DynamicValue::Builder::as<int>(&local_310);
  DynamicValue::Builder::~Builder(&local_310);
  if (BVar7 != 0) {
    local_321 = kj::_::Debug::shouldLog(ERROR);
    while (local_321 != false) {
      local_328 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_380,"int32Field");
      DynamicStruct::Builder::get(&local_370,(Builder *)&stack0x00000008,(StringPtr)local_380);
      local_32c = DynamicValue::Builder::as<int>(&local_370);
      kj::_::Debug::log<char_const(&)[74],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x20f,ERROR,
                 "\"failed: expected \" \"(0) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", 0, reader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [74])
                  "failed: expected (0) == (reader.get(\"int32Field\").template as<int32_t>())",
                 &local_328,&local_32c);
      DynamicValue::Builder::~Builder(&local_370);
      local_321 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3d0,"int64Field");
  DynamicStruct::Builder::get(&local_3c0,(Builder *)&stack0x00000008,(StringPtr)_auStack_3d0);
  BVar10 = DynamicValue::Builder::as<long>(&local_3c0);
  DynamicValue::Builder::~Builder(&local_3c0);
  if (BVar10 != 0) {
    local_3d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3d1 != false) {
      local_3d8 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_430,"int64Field");
      DynamicStruct::Builder::get(&local_420,(Builder *)&stack0x00000008,(StringPtr)local_430);
      local_3e0 = DynamicValue::Builder::as<long>(&local_420);
      kj::_::Debug::log<char_const(&)[74],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x210,ERROR,
                 "\"failed: expected \" \"(0) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", 0, reader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [74])
                  "failed: expected (0) == (reader.get(\"int64Field\").template as<int64_t>())",
                 &local_3d8,&local_3e0);
      DynamicValue::Builder::~Builder(&local_420);
      local_3d1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_480,"uInt8Field");
  DynamicStruct::Builder::get(&local_470,(Builder *)&stack0x00000008,(StringPtr)_auStack_480);
  BVar4 = DynamicValue::Builder::as<unsigned_char>(&local_470);
  DynamicValue::Builder::~Builder(&local_470);
  if (BVar4 != '\0') {
    local_481 = kj::_::Debug::shouldLog(ERROR);
    while (local_481 != false) {
      local_488 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_4e0,"uInt8Field");
      DynamicStruct::Builder::get(&local_4d0,(Builder *)&stack0x00000008,(StringPtr)local_4e0);
      local_489 = DynamicValue::Builder::as<unsigned_char>(&local_4d0);
      kj::_::Debug::log<char_const(&)[75],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x211,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 0u, reader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [75])
                  "failed: expected (0u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
                 &local_488,&local_489);
      DynamicValue::Builder::~Builder(&local_4d0);
      local_481 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_530,"uInt16Field");
  DynamicStruct::Builder::get(&local_520,(Builder *)&stack0x00000008,(StringPtr)_auStack_530);
  BVar6 = DynamicValue::Builder::as<unsigned_short>(&local_520);
  DynamicValue::Builder::~Builder(&local_520);
  if (BVar6 != 0) {
    local_531 = kj::_::Debug::shouldLog(ERROR);
    while (local_531 != false) {
      local_538 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_590,"uInt16Field");
      DynamicStruct::Builder::get(&local_580,(Builder *)&stack0x00000008,(StringPtr)local_590);
      local_53a = DynamicValue::Builder::as<unsigned_short>(&local_580);
      kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x212,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 0u, reader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [77])
                  "failed: expected (0u) == (reader.get(\"uInt16Field\").template as<uint16_t>())",
                 &local_538,&local_53a);
      DynamicValue::Builder::~Builder(&local_580);
      local_531 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_5e0,"uInt32Field");
  DynamicStruct::Builder::get(&local_5d0,(Builder *)&stack0x00000008,(StringPtr)_auStack_5e0);
  BVar8 = DynamicValue::Builder::as<unsigned_int>(&local_5d0);
  DynamicValue::Builder::~Builder(&local_5d0);
  if (BVar8 != 0) {
    local_5e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e1 != false) {
      local_5e8 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_640,"uInt32Field");
      DynamicStruct::Builder::get(&local_630,(Builder *)&stack0x00000008,(StringPtr)local_640);
      local_5ec = DynamicValue::Builder::as<unsigned_int>(&local_630);
      kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x213,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 0u, reader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [77])
                  "failed: expected (0u) == (reader.get(\"uInt32Field\").template as<uint32_t>())",
                 &local_5e8,&local_5ec);
      DynamicValue::Builder::~Builder(&local_630);
      local_5e1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_690,"uInt64Field");
  DynamicStruct::Builder::get(&local_680,(Builder *)&stack0x00000008,(StringPtr)_auStack_690);
  BVar11 = DynamicValue::Builder::as<unsigned_long>(&local_680);
  DynamicValue::Builder::~Builder(&local_680);
  if (BVar11 != 0) {
    local_691 = kj::_::Debug::shouldLog(ERROR);
    while (local_691 != false) {
      local_698 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_6f0,"uInt64Field");
      DynamicStruct::Builder::get(&local_6e0,(Builder *)&stack0x00000008,(StringPtr)local_6f0);
      local_6a0 = DynamicValue::Builder::as<unsigned_long>(&local_6e0);
      kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x214,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 0u, reader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [77])
                  "failed: expected (0u) == (reader.get(\"uInt64Field\").template as<uint64_t>())",
                 &local_698,&local_6a0);
      DynamicValue::Builder::~Builder(&local_6e0);
      local_691 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_740,"float32Field");
  DynamicStruct::Builder::get(&local_730,(Builder *)&stack0x00000008,(StringPtr)_auStack_740);
  BVar12 = DynamicValue::Builder::as<float>(&local_730);
  bVar1 = kj::_::floatAlmostEqual(BVar12,0.0);
  DynamicValue::Builder::~Builder(&local_730);
  if (!bVar1) {
    local_741 = kj::_::Debug::shouldLog(ERROR);
    while (local_741 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_798,"float32Field");
      DynamicStruct::Builder::get(&local_788,(Builder *)&stack0x00000008,(StringPtr)local_798);
      local_748 = DynamicValue::Builder::as<float>(&local_788);
      local_79c = 0;
      kj::_::Debug::log<char_const(&)[95],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x215,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 0)\", reader.get(\"float32Field\").template as<float>(), 0"
                 ,(char (*) [95])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 0)"
                 ,&local_748,&local_79c);
      DynamicValue::Builder::~Builder(&local_788);
      local_741 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_7f0,"float64Field");
  DynamicStruct::Builder::get(&local_7e0,(Builder *)&stack0x00000008,(StringPtr)_auStack_7f0);
  BVar13 = DynamicValue::Builder::as<double>(&local_7e0);
  bVar1 = kj::_::doubleAlmostEqual(BVar13,0.0);
  DynamicValue::Builder::~Builder(&local_7e0);
  if (!bVar1) {
    local_7f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7f1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_850,"float64Field");
      DynamicStruct::Builder::get(&local_840,(Builder *)&stack0x00000008,(StringPtr)local_850);
      local_800 = DynamicValue::Builder::as<double>(&local_840);
      local_854 = 0;
      kj::_::Debug::log<char_const(&)[97],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x216,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), 0)\", reader.get(\"float64Field\").template as<double>(), 0"
                 ,(char (*) [97])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), 0)"
                 ,&local_800,&local_854);
      DynamicValue::Builder::~Builder(&local_840);
      local_7f1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_8c0,"textField");
  DynamicStruct::Builder::get(&local_8b0,(Builder *)&stack0x00000008,(StringPtr)_auStack_8c0);
  DynamicValue::Builder::as<capnp::Text>(&local_870,&local_8b0);
  bVar1 = capnp::operator==("",&local_870);
  DynamicValue::Builder::~Builder(&local_8b0);
  if (!bVar1) {
    local_8c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8c1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_930,"textField");
      DynamicStruct::Builder::get(&local_920,(Builder *)&stack0x00000008,(StringPtr)local_930);
      DynamicValue::Builder::as<capnp::Text>(&local_8e0,&local_920);
      kj::_::Debug::log<char_const(&)[71],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x217,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"\", reader.get(\"textField\").template as<Text>()"
                 ,(char (*) [71])
                  "failed: expected (\"\") == (reader.get(\"textField\").template as<Text>())",
                 (char (*) [1])0xa68054,&local_8e0);
      DynamicValue::Builder::~Builder(&local_920);
      local_8c1 = false;
    }
  }
  local_940 = (ArrayPtr<const_unsigned_char>)_::data("");
  kj::StringPtr::StringPtr((StringPtr *)auStack_9a0,"dataField");
  DynamicStruct::Builder::get(&local_990,(Builder *)&stack0x00000008,(StringPtr)_auStack_9a0);
  local_950 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_990);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_940,&local_950);
  DynamicValue::Builder::~Builder(&local_990);
  if (!bVar1) {
    local_9a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9a1 != false) {
      local_9b8 = (ArrayPtr<const_unsigned_char>)_::data("");
      kj::StringPtr::StringPtr((StringPtr *)&subReader.builder.dataSize,"dataField");
      DynamicStruct::Builder::get
                (&local_a08,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff5e8);
      AVar14 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_a08);
      local_9c8 = AVar14;
      kj::_::Debug::log<char_const(&)[77],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x218,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"\"), reader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [77])
                  "failed: expected (data(\"\")) == (reader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_9b8,(Builder *)&local_9c8);
      DynamicValue::Builder::~Builder(&local_a08);
      local_9a1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_a98,"structField");
  DynamicStruct::Builder::get(&local_a88,(Builder *)&stack0x00000008,(StringPtr)local_a98);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_a48,&local_a88);
  DynamicValue::Builder::~Builder(&local_a88);
  kj::StringPtr::StringPtr((StringPtr *)auStack_af0,"voidField");
  DynamicStruct::Builder::get(&local_ae0,(Builder *)local_a48,(StringPtr)_auStack_af0);
  DynamicValue::Builder::as<capnp::Void>(&local_ae0);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Builder::~Builder(&local_ae0);
  if (!bVar1) {
    local_af2 = kj::_::Debug::shouldLog(ERROR);
    while (local_af2 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_b48,"voidField");
      DynamicStruct::Builder::get(&local_b38,(Builder *)local_a48,(StringPtr)local_b48);
      DynamicValue::Builder::as<capnp::Void>(&local_b38);
      kj::_::Debug::log<char_const(&)[76],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x21b,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", VOID, subReader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [76])
                  "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
                 (Void *)&VOID,&local_af3);
      DynamicValue::Builder::~Builder(&local_b38);
      local_af2 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_ba0,"boolField");
  DynamicStruct::Builder::get(&local_b90,(Builder *)local_a48,(StringPtr)_auStack_ba0);
  BVar2 = DynamicValue::Builder::as<bool>(&local_b90);
  DynamicValue::Builder::~Builder(&local_b90);
  if (BVar2) {
    local_ba1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ba1 != false) {
      local_ba2 = false;
      kj::StringPtr::StringPtr((StringPtr *)&local_bf8,"boolField");
      DynamicStruct::Builder::get(&local_be8,(Builder *)local_a48,(StringPtr)local_bf8);
      local_ba3 = DynamicValue::Builder::as<bool>(&local_be8);
      kj::_::Debug::log<char_const(&)[77],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x21c,ERROR,
                 "\"failed: expected \" \"(false) == (subReader.get(\\\"boolField\\\").template as<bool>())\", false, subReader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [77])
                  "failed: expected (false) == (subReader.get(\"boolField\").template as<bool>())",
                 &local_ba2,&local_ba3);
      DynamicValue::Builder::~Builder(&local_be8);
      local_ba1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_c48,"int8Field");
  DynamicStruct::Builder::get(&local_c38,(Builder *)local_a48,(StringPtr)_auStack_c48);
  BVar3 = DynamicValue::Builder::as<signed_char>(&local_c38);
  DynamicValue::Builder::~Builder(&local_c38);
  if (BVar3 != '\0') {
    local_c49 = kj::_::Debug::shouldLog(ERROR);
    while (local_c49 != false) {
      local_c50 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_ca8,"int8Field");
      DynamicStruct::Builder::get(&local_c98,(Builder *)local_a48,(StringPtr)local_ca8);
      local_c51 = DynamicValue::Builder::as<signed_char>(&local_c98);
      kj::_::Debug::log<char_const(&)[75],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x21d,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", 0, subReader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [75])
                  "failed: expected (0) == (subReader.get(\"int8Field\").template as<int8_t>())",
                 &local_c50,&local_c51);
      DynamicValue::Builder::~Builder(&local_c98);
      local_c49 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_cf8,"int16Field");
  DynamicStruct::Builder::get(&local_ce8,(Builder *)local_a48,(StringPtr)_auStack_cf8);
  BVar5 = DynamicValue::Builder::as<short>(&local_ce8);
  DynamicValue::Builder::~Builder(&local_ce8);
  if (BVar5 != 0) {
    local_cf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_cf9 != false) {
      local_d00 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_d58,"int16Field");
      DynamicStruct::Builder::get(&local_d48,(Builder *)local_a48,(StringPtr)local_d58);
      local_d02 = DynamicValue::Builder::as<short>(&local_d48);
      kj::_::Debug::log<char_const(&)[77],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x21e,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 0, subReader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [77])
                  "failed: expected (0) == (subReader.get(\"int16Field\").template as<int16_t>())",
                 &local_d00,&local_d02);
      DynamicValue::Builder::~Builder(&local_d48);
      local_cf9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_da8,"int32Field");
  DynamicStruct::Builder::get(&local_d98,(Builder *)local_a48,(StringPtr)_auStack_da8);
  BVar7 = DynamicValue::Builder::as<int>(&local_d98);
  DynamicValue::Builder::~Builder(&local_d98);
  if (BVar7 != 0) {
    local_da9 = kj::_::Debug::shouldLog(ERROR);
    while (local_da9 != false) {
      local_db0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_e08,"int32Field");
      DynamicStruct::Builder::get(&local_df8,(Builder *)local_a48,(StringPtr)local_e08);
      local_db4 = DynamicValue::Builder::as<int>(&local_df8);
      kj::_::Debug::log<char_const(&)[77],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x21f,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", 0, subReader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [77])
                  "failed: expected (0) == (subReader.get(\"int32Field\").template as<int32_t>())",
                 &local_db0,&local_db4);
      DynamicValue::Builder::~Builder(&local_df8);
      local_da9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_e58,"int64Field");
  DynamicStruct::Builder::get(&local_e48,(Builder *)local_a48,(StringPtr)_auStack_e58);
  BVar10 = DynamicValue::Builder::as<long>(&local_e48);
  DynamicValue::Builder::~Builder(&local_e48);
  if (BVar10 != 0) {
    local_e59 = kj::_::Debug::shouldLog(ERROR);
    while (local_e59 != false) {
      local_e60 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_eb8,"int64Field");
      DynamicStruct::Builder::get(&local_ea8,(Builder *)local_a48,(StringPtr)local_eb8);
      local_e68 = DynamicValue::Builder::as<long>(&local_ea8);
      kj::_::Debug::log<char_const(&)[77],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x220,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 0, subReader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [77])
                  "failed: expected (0) == (subReader.get(\"int64Field\").template as<int64_t>())",
                 &local_e60,&local_e68);
      DynamicValue::Builder::~Builder(&local_ea8);
      local_e59 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_f08,"uInt8Field");
  DynamicStruct::Builder::get(&local_ef8,(Builder *)local_a48,(StringPtr)_auStack_f08);
  BVar4 = DynamicValue::Builder::as<unsigned_char>(&local_ef8);
  DynamicValue::Builder::~Builder(&local_ef8);
  if (BVar4 != '\0') {
    local_f09 = kj::_::Debug::shouldLog(ERROR);
    while (local_f09 != false) {
      local_f10 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_f68,"uInt8Field");
      DynamicStruct::Builder::get(&local_f58,(Builder *)local_a48,(StringPtr)local_f68);
      local_f11 = DynamicValue::Builder::as<unsigned_char>(&local_f58);
      kj::_::Debug::log<char_const(&)[78],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x221,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 0u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [78])
                  "failed: expected (0u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
                 &local_f10,&local_f11);
      DynamicValue::Builder::~Builder(&local_f58);
      local_f09 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_fb8,"uInt16Field");
  DynamicStruct::Builder::get(&local_fa8,(Builder *)local_a48,(StringPtr)_auStack_fb8);
  BVar6 = DynamicValue::Builder::as<unsigned_short>(&local_fa8);
  DynamicValue::Builder::~Builder(&local_fa8);
  if (BVar6 != 0) {
    local_fb9 = kj::_::Debug::shouldLog(ERROR);
    while (local_fb9 != false) {
      local_fc0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1018,"uInt16Field");
      DynamicStruct::Builder::get(&local_1008,(Builder *)local_a48,(StringPtr)local_1018);
      local_fc2 = DynamicValue::Builder::as<unsigned_short>(&local_1008);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x222,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 0u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [80])
                  "failed: expected (0u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,&local_fc0,&local_fc2);
      DynamicValue::Builder::~Builder(&local_1008);
      local_fb9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1068,"uInt32Field");
  DynamicStruct::Builder::get(&local_1058,(Builder *)local_a48,(StringPtr)_auStack_1068);
  BVar8 = DynamicValue::Builder::as<unsigned_int>(&local_1058);
  DynamicValue::Builder::~Builder(&local_1058);
  if (BVar8 != 0) {
    local_1069 = kj::_::Debug::shouldLog(ERROR);
    while (local_1069 != false) {
      local_1070 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_10c8,"uInt32Field");
      DynamicStruct::Builder::get(&local_10b8,(Builder *)local_a48,(StringPtr)local_10c8);
      local_1074 = DynamicValue::Builder::as<unsigned_int>(&local_10b8);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x223,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 0u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [80])
                  "failed: expected (0u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,&local_1070,&local_1074);
      DynamicValue::Builder::~Builder(&local_10b8);
      local_1069 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1118,"uInt64Field");
  DynamicStruct::Builder::get(&local_1108,(Builder *)local_a48,(StringPtr)_auStack_1118);
  BVar11 = DynamicValue::Builder::as<unsigned_long>(&local_1108);
  DynamicValue::Builder::~Builder(&local_1108);
  if (BVar11 != 0) {
    local_1119 = kj::_::Debug::shouldLog(ERROR);
    while (local_1119 != false) {
      local_1120 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1178,"uInt64Field");
      DynamicStruct::Builder::get(&local_1168,(Builder *)local_a48,(StringPtr)local_1178);
      local_1128 = DynamicValue::Builder::as<unsigned_long>(&local_1168);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x224,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 0u, subReader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [80])
                  "failed: expected (0u) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,&local_1120,&local_1128);
      DynamicValue::Builder::~Builder(&local_1168);
      local_1119 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_11c8,"float32Field");
  DynamicStruct::Builder::get(&local_11b8,(Builder *)local_a48,(StringPtr)_auStack_11c8);
  BVar12 = DynamicValue::Builder::as<float>(&local_11b8);
  bVar1 = kj::_::floatAlmostEqual(BVar12,0.0);
  DynamicValue::Builder::~Builder(&local_11b8);
  if (!bVar1) {
    local_11c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11c9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1220,"float32Field");
      DynamicStruct::Builder::get(&local_1210,(Builder *)local_a48,(StringPtr)local_1220);
      local_11d0 = DynamicValue::Builder::as<float>(&local_1210);
      local_1224 = 0;
      kj::_::Debug::log<char_const(&)[98],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x225,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), 0)\", subReader.get(\"float32Field\").template as<float>(), 0"
                 ,(char (*) [98])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), 0)"
                 ,&local_11d0,&local_1224);
      DynamicValue::Builder::~Builder(&local_1210);
      local_11c9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1278,"float64Field");
  DynamicStruct::Builder::get(&local_1268,(Builder *)local_a48,(StringPtr)_auStack_1278);
  BVar13 = DynamicValue::Builder::as<double>(&local_1268);
  bVar1 = kj::_::doubleAlmostEqual(BVar13,0.0);
  DynamicValue::Builder::~Builder(&local_1268);
  if (!bVar1) {
    local_1279 = kj::_::Debug::shouldLog(ERROR);
    while (local_1279 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_12d8,"float64Field");
      DynamicStruct::Builder::get(&local_12c8,(Builder *)local_a48,(StringPtr)local_12d8);
      local_1288 = DynamicValue::Builder::as<double>(&local_12c8);
      local_12dc = 0;
      kj::_::Debug::log<char_const(&)[100],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x226,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 0)\", subReader.get(\"float64Field\").template as<double>(), 0"
                 ,(char (*) [100])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 0)"
                 ,&local_1288,&local_12dc);
      DynamicValue::Builder::~Builder(&local_12c8);
      local_1279 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1348,"textField");
  DynamicStruct::Builder::get(&local_1338,(Builder *)local_a48,(StringPtr)_auStack_1348);
  DynamicValue::Builder::as<capnp::Text>(&local_12f8,&local_1338);
  bVar1 = capnp::operator==("",&local_12f8);
  DynamicValue::Builder::~Builder(&local_1338);
  if (!bVar1) {
    local_1349 = kj::_::Debug::shouldLog(ERROR);
    while (local_1349 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_13b8,"textField");
      DynamicStruct::Builder::get(&local_13a8,(Builder *)local_a48,(StringPtr)local_13b8);
      DynamicValue::Builder::as<capnp::Text>(&local_1368,&local_13a8);
      kj::_::Debug::log<char_const(&)[74],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x227,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"\", subReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [74])
                  "failed: expected (\"\") == (subReader.get(\"textField\").template as<Text>())",
                 (char (*) [1])0xa68054,&local_1368);
      DynamicValue::Builder::~Builder(&local_13a8);
      local_1349 = false;
    }
  }
  local_13c8 = (ArrayPtr<const_unsigned_char>)_::data("");
  kj::StringPtr::StringPtr((StringPtr *)auStack_1428,"dataField");
  DynamicStruct::Builder::get(&local_1418,(Builder *)local_a48,(StringPtr)_auStack_1428);
  local_13d8 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_1418);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_13c8,&local_13d8);
  DynamicValue::Builder::~Builder(&local_1418);
  if (!bVar1) {
    local_1429 = kj::_::Debug::shouldLog(ERROR);
    while (local_1429 != false) {
      local_1440 = (ArrayPtr<const_unsigned_char>)_::data("");
      kj::StringPtr::StringPtr((StringPtr *)&subSubReader.builder.dataSize,"dataField");
      DynamicStruct::Builder::get
                (&local_1490,(Builder *)local_a48,(StringPtr)stack0xffffffffffffeb60);
      AVar14 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_1490);
      local_1450 = AVar14;
      kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x228,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"\"), subReader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [80])
                  "failed: expected (data(\"\")) == (subReader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_1440,(Builder *)&local_1450);
      DynamicValue::Builder::~Builder(&local_1490);
      local_1429 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1520,"structField");
  DynamicStruct::Builder::get(&local_1510,(Builder *)local_a48,(StringPtr)local_1520);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_14d0,&local_1510);
  DynamicValue::Builder::~Builder(&local_1510);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1588,"textField");
  DynamicStruct::Builder::get(&local_1578,(Builder *)local_14d0,(StringPtr)_auStack_1588);
  DynamicValue::Builder::as<capnp::Text>(&local_1538,&local_1578);
  bVar1 = capnp::operator==("",&local_1538);
  DynamicValue::Builder::~Builder(&local_1578);
  if (!bVar1) {
    local_1589 = kj::_::Debug::shouldLog(ERROR);
    while (local_1589 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_15f8,"textField");
      DynamicStruct::Builder::get(&local_15e8,(Builder *)local_14d0,(StringPtr)local_15f8);
      DynamicValue::Builder::as<capnp::Text>(&local_15a8,&local_15e8);
      kj::_::Debug::log<char_const(&)[77],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x22b,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"\", subSubReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [77])
                  "failed: expected (\"\") == (subSubReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [1])0xa68054,&local_15a8);
      DynamicValue::Builder::~Builder(&local_15e8);
      local_1589 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_16d0,"structField");
  DynamicStruct::Builder::get(&local_16c0,(Builder *)local_14d0,(StringPtr)local_16d0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1680,&local_16c0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_16e0,"textField");
  DynamicStruct::Builder::get(&local_1650,&local_1680,(StringPtr)_auStack_16e0);
  DynamicValue::Builder::as<capnp::Text>(&local_1610,&local_1650);
  bVar1 = capnp::operator==("",&local_1610);
  DynamicValue::Builder::~Builder(&local_1650);
  DynamicValue::Builder::~Builder(&local_16c0);
  if (!bVar1) {
    local_16e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_16e1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_17c0,"structField");
      DynamicStruct::Builder::get(&local_17b0,(Builder *)local_14d0,(StringPtr)local_17c0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1770,&local_17b0);
      kj::StringPtr::StringPtr((StringPtr *)&local_17d0,"textField");
      DynamicStruct::Builder::get(&local_1740,&local_1770,(StringPtr)local_17d0);
      DynamicValue::Builder::as<capnp::Text>(&local_1700,&local_1740);
      kj::_::Debug::log<char_const(&)[126],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x22d,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
                 ,(char (*) [126])
                  "failed: expected (\"\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
                 ,(char (*) [1])0xa68054,&local_1700);
      DynamicValue::Builder::~Builder(&local_1740);
      DynamicValue::Builder::~Builder(&local_17b0);
      local_16e1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1858,"voidList");
  DynamicStruct::Builder::get(&local_1848,(Builder *)local_a48,(StringPtr)_auStack_1858);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1808,&local_1848);
  uVar9 = DynamicList::Builder::size(&local_1808);
  DynamicValue::Builder::~Builder(&local_1848);
  if (uVar9 != 0) {
    local_1859 = kj::_::Debug::shouldLog(ERROR);
    while (local_1859 != false) {
      local_1860 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_18f0,"voidList");
      DynamicStruct::Builder::get(&local_18e0,(Builder *)local_a48,(StringPtr)local_18f0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_18a0,&local_18e0);
      local_1864 = DynamicList::Builder::size(&local_18a0);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x230,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (subReader.get(\"voidList\").template as<DynamicList>().size())"
                 ,&local_1860,&local_1864);
      DynamicValue::Builder::~Builder(&local_18e0);
      local_1859 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1978,"boolList");
  DynamicStruct::Builder::get(&local_1968,(Builder *)local_a48,(StringPtr)_auStack_1978);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1928,&local_1968);
  uVar9 = DynamicList::Builder::size(&local_1928);
  DynamicValue::Builder::~Builder(&local_1968);
  if (uVar9 != 0) {
    local_1979 = kj::_::Debug::shouldLog(ERROR);
    while (local_1979 != false) {
      local_1980 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1a10,"boolList");
      DynamicStruct::Builder::get(&local_1a00,(Builder *)local_a48,(StringPtr)local_1a10);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_19c0,&local_1a00);
      local_1984 = DynamicList::Builder::size(&local_19c0);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x231,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"boolList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"boolList\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (subReader.get(\"boolList\").template as<DynamicList>().size())"
                 ,&local_1980,&local_1984);
      DynamicValue::Builder::~Builder(&local_1a00);
      local_1979 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1a98,"int8List");
  DynamicStruct::Builder::get(&local_1a88,(Builder *)local_a48,(StringPtr)_auStack_1a98);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1a48,&local_1a88);
  uVar9 = DynamicList::Builder::size(&local_1a48);
  DynamicValue::Builder::~Builder(&local_1a88);
  if (uVar9 != 0) {
    local_1a99 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a99 != false) {
      local_1aa0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1b30,"int8List");
      DynamicStruct::Builder::get(&local_1b20,(Builder *)local_a48,(StringPtr)local_1b30);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1ae0,&local_1b20);
      local_1aa4 = DynamicList::Builder::size(&local_1ae0);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x232,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"int8List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int8List\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (subReader.get(\"int8List\").template as<DynamicList>().size())"
                 ,&local_1aa0,&local_1aa4);
      DynamicValue::Builder::~Builder(&local_1b20);
      local_1a99 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1bb8,"int16List");
  DynamicStruct::Builder::get(&local_1ba8,(Builder *)local_a48,(StringPtr)_auStack_1bb8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1b68,&local_1ba8);
  uVar9 = DynamicList::Builder::size(&local_1b68);
  DynamicValue::Builder::~Builder(&local_1ba8);
  if (uVar9 != 0) {
    local_1bb9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1bb9 != false) {
      local_1bc0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1c50,"int16List");
      DynamicStruct::Builder::get(&local_1c40,(Builder *)local_a48,(StringPtr)local_1c50);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1c00,&local_1c40);
      local_1bc4 = DynamicList::Builder::size(&local_1c00);
      kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"int16List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int16List\").template as<DynamicList>().size()"
                 ,(char (*) [88])
                  "failed: expected (0u) == (subReader.get(\"int16List\").template as<DynamicList>().size())"
                 ,&local_1bc0,&local_1bc4);
      DynamicValue::Builder::~Builder(&local_1c40);
      local_1bb9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1cd8,"int32List");
  DynamicStruct::Builder::get(&local_1cc8,(Builder *)local_a48,(StringPtr)_auStack_1cd8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1c88,&local_1cc8);
  uVar9 = DynamicList::Builder::size(&local_1c88);
  DynamicValue::Builder::~Builder(&local_1cc8);
  if (uVar9 != 0) {
    local_1cd9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1cd9 != false) {
      local_1ce0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1d70,"int32List");
      DynamicStruct::Builder::get(&local_1d60,(Builder *)local_a48,(StringPtr)local_1d70);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1d20,&local_1d60);
      local_1ce4 = DynamicList::Builder::size(&local_1d20);
      kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x234,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"int32List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int32List\").template as<DynamicList>().size()"
                 ,(char (*) [88])
                  "failed: expected (0u) == (subReader.get(\"int32List\").template as<DynamicList>().size())"
                 ,&local_1ce0,&local_1ce4);
      DynamicValue::Builder::~Builder(&local_1d60);
      local_1cd9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1df8,"int64List");
  DynamicStruct::Builder::get(&local_1de8,(Builder *)local_a48,(StringPtr)_auStack_1df8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1da8,&local_1de8);
  uVar9 = DynamicList::Builder::size(&local_1da8);
  DynamicValue::Builder::~Builder(&local_1de8);
  if (uVar9 != 0) {
    local_1df9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1df9 != false) {
      local_1e00 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1e90,"int64List");
      DynamicStruct::Builder::get(&local_1e80,(Builder *)local_a48,(StringPtr)local_1e90);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1e40,&local_1e80);
      local_1e04 = DynamicList::Builder::size(&local_1e40);
      kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x235,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"int64List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int64List\").template as<DynamicList>().size()"
                 ,(char (*) [88])
                  "failed: expected (0u) == (subReader.get(\"int64List\").template as<DynamicList>().size())"
                 ,&local_1e00,&local_1e04);
      DynamicValue::Builder::~Builder(&local_1e80);
      local_1df9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1f18,"uInt8List");
  DynamicStruct::Builder::get(&local_1f08,(Builder *)local_a48,(StringPtr)_auStack_1f18);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1ec8,&local_1f08);
  uVar9 = DynamicList::Builder::size(&local_1ec8);
  DynamicValue::Builder::~Builder(&local_1f08);
  if (uVar9 != 0) {
    local_1f19 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f19 != false) {
      local_1f20 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_1fb0,"uInt8List");
      DynamicStruct::Builder::get(&local_1fa0,(Builder *)local_a48,(StringPtr)local_1fb0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_1f60,&local_1fa0);
      local_1f24 = DynamicList::Builder::size(&local_1f60);
      kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x236,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt8List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt8List\").template as<DynamicList>().size()"
                 ,(char (*) [88])
                  "failed: expected (0u) == (subReader.get(\"uInt8List\").template as<DynamicList>().size())"
                 ,&local_1f20,&local_1f24);
      DynamicValue::Builder::~Builder(&local_1fa0);
      local_1f19 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2038,"uInt16List");
  DynamicStruct::Builder::get(&local_2028,(Builder *)local_a48,(StringPtr)_auStack_2038);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1fe8,&local_2028);
  uVar9 = DynamicList::Builder::size(&local_1fe8);
  DynamicValue::Builder::~Builder(&local_2028);
  if (uVar9 != 0) {
    local_2039 = kj::_::Debug::shouldLog(ERROR);
    while (local_2039 != false) {
      local_2040 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_20d0,"uInt16List");
      DynamicStruct::Builder::get(&local_20c0,(Builder *)local_a48,(StringPtr)local_20d0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2080,&local_20c0);
      local_2044 = DynamicList::Builder::size(&local_2080);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x237,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt16List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt16List\").template as<DynamicList>().size()"
                 ,(char (*) [89])
                  "failed: expected (0u) == (subReader.get(\"uInt16List\").template as<DynamicList>().size())"
                 ,&local_2040,&local_2044);
      DynamicValue::Builder::~Builder(&local_20c0);
      local_2039 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2158,"uInt32List");
  DynamicStruct::Builder::get(&local_2148,(Builder *)local_a48,(StringPtr)_auStack_2158);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2108,&local_2148);
  uVar9 = DynamicList::Builder::size(&local_2108);
  DynamicValue::Builder::~Builder(&local_2148);
  if (uVar9 != 0) {
    local_2159 = kj::_::Debug::shouldLog(ERROR);
    while (local_2159 != false) {
      local_2160 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_21f0,"uInt32List");
      DynamicStruct::Builder::get(&local_21e0,(Builder *)local_a48,(StringPtr)local_21f0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_21a0,&local_21e0);
      local_2164 = DynamicList::Builder::size(&local_21a0);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x238,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt32List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt32List\").template as<DynamicList>().size()"
                 ,(char (*) [89])
                  "failed: expected (0u) == (subReader.get(\"uInt32List\").template as<DynamicList>().size())"
                 ,&local_2160,&local_2164);
      DynamicValue::Builder::~Builder(&local_21e0);
      local_2159 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2278,"uInt64List");
  DynamicStruct::Builder::get(&local_2268,(Builder *)local_a48,(StringPtr)_auStack_2278);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2228,&local_2268);
  uVar9 = DynamicList::Builder::size(&local_2228);
  DynamicValue::Builder::~Builder(&local_2268);
  if (uVar9 != 0) {
    local_2279 = kj::_::Debug::shouldLog(ERROR);
    while (local_2279 != false) {
      local_2280 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2310,"uInt64List");
      DynamicStruct::Builder::get(&local_2300,(Builder *)local_a48,(StringPtr)local_2310);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_22c0,&local_2300);
      local_2284 = DynamicList::Builder::size(&local_22c0);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x239,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt64List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt64List\").template as<DynamicList>().size()"
                 ,(char (*) [89])
                  "failed: expected (0u) == (subReader.get(\"uInt64List\").template as<DynamicList>().size())"
                 ,&local_2280,&local_2284);
      DynamicValue::Builder::~Builder(&local_2300);
      local_2279 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2398,"float32List");
  DynamicStruct::Builder::get(&local_2388,(Builder *)local_a48,(StringPtr)_auStack_2398);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2348,&local_2388);
  uVar9 = DynamicList::Builder::size(&local_2348);
  DynamicValue::Builder::~Builder(&local_2388);
  if (uVar9 != 0) {
    local_2399 = kj::_::Debug::shouldLog(ERROR);
    while (local_2399 != false) {
      local_23a0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2430,"float32List");
      DynamicStruct::Builder::get(&local_2420,(Builder *)local_a48,(StringPtr)local_2430);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_23e0,&local_2420);
      local_23a4 = DynamicList::Builder::size(&local_23e0);
      kj::_::Debug::log<char_const(&)[90],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"float32List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"float32List\").template as<DynamicList>().size()"
                 ,(char (*) [90])
                  "failed: expected (0u) == (subReader.get(\"float32List\").template as<DynamicList>().size())"
                 ,&local_23a0,&local_23a4);
      DynamicValue::Builder::~Builder(&local_2420);
      local_2399 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_24b8,"float64List");
  DynamicStruct::Builder::get(&local_24a8,(Builder *)local_a48,(StringPtr)_auStack_24b8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2468,&local_24a8);
  uVar9 = DynamicList::Builder::size(&local_2468);
  DynamicValue::Builder::~Builder(&local_24a8);
  if (uVar9 != 0) {
    local_24b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_24b9 != false) {
      local_24c0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2550,"float64List");
      DynamicStruct::Builder::get(&local_2540,(Builder *)local_a48,(StringPtr)local_2550);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2500,&local_2540);
      local_24c4 = DynamicList::Builder::size(&local_2500);
      kj::_::Debug::log<char_const(&)[90],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x23b,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"float64List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"float64List\").template as<DynamicList>().size()"
                 ,(char (*) [90])
                  "failed: expected (0u) == (subReader.get(\"float64List\").template as<DynamicList>().size())"
                 ,&local_24c0,&local_24c4);
      DynamicValue::Builder::~Builder(&local_2540);
      local_24b9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_25d8,"textList");
  DynamicStruct::Builder::get(&local_25c8,(Builder *)local_a48,(StringPtr)_auStack_25d8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2588,&local_25c8);
  uVar9 = DynamicList::Builder::size(&local_2588);
  DynamicValue::Builder::~Builder(&local_25c8);
  if (uVar9 != 0) {
    local_25d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_25d9 != false) {
      local_25e0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2670,"textList");
      DynamicStruct::Builder::get(&local_2660,(Builder *)local_a48,(StringPtr)local_2670);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2620,&local_2660);
      local_25e4 = DynamicList::Builder::size(&local_2620);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x23c,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"textList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"textList\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (subReader.get(\"textList\").template as<DynamicList>().size())"
                 ,&local_25e0,&local_25e4);
      DynamicValue::Builder::~Builder(&local_2660);
      local_25d9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_26f8,"dataList");
  DynamicStruct::Builder::get(&local_26e8,(Builder *)local_a48,(StringPtr)_auStack_26f8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_26a8,&local_26e8);
  uVar9 = DynamicList::Builder::size(&local_26a8);
  DynamicValue::Builder::~Builder(&local_26e8);
  if (uVar9 != 0) {
    local_26f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_26f9 != false) {
      local_2700 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2790,"dataList");
      DynamicStruct::Builder::get(&local_2780,(Builder *)local_a48,(StringPtr)local_2790);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2740,&local_2780);
      local_2704 = DynamicList::Builder::size(&local_2740);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x23d,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"dataList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"dataList\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (subReader.get(\"dataList\").template as<DynamicList>().size())"
                 ,&local_2700,&local_2704);
      DynamicValue::Builder::~Builder(&local_2780);
      local_26f9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2818,"structList");
  DynamicStruct::Builder::get(&local_2808,(Builder *)local_a48,(StringPtr)_auStack_2818);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_27c8,&local_2808);
  uVar9 = DynamicList::Builder::size(&local_27c8);
  DynamicValue::Builder::~Builder(&local_2808);
  if (uVar9 != 0) {
    local_2819 = kj::_::Debug::shouldLog(ERROR);
    while (local_2819 != false) {
      local_2820 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_28b0,"structList");
      DynamicStruct::Builder::get(&local_28a0,(Builder *)local_a48,(StringPtr)local_28b0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2860,&local_28a0);
      local_2824 = DynamicList::Builder::size(&local_2860);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x23e,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.get(\\\"structList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"structList\").template as<DynamicList>().size()"
                 ,(char (*) [89])
                  "failed: expected (0u) == (subReader.get(\"structList\").template as<DynamicList>().size())"
                 ,&local_2820,&local_2824);
      DynamicValue::Builder::~Builder(&local_28a0);
      local_2819 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2938,"voidList");
  DynamicStruct::Builder::get(&local_2928,(Builder *)&stack0x00000008,(StringPtr)_auStack_2938);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_28e8,&local_2928);
  uVar9 = DynamicList::Builder::size(&local_28e8);
  DynamicValue::Builder::~Builder(&local_2928);
  if (uVar9 != 0) {
    local_2939 = kj::_::Debug::shouldLog(ERROR);
    while (local_2939 != false) {
      local_2940 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_29d0,"voidList");
      DynamicStruct::Builder::get(&local_29c0,(Builder *)&stack0x00000008,(StringPtr)local_29d0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2980,&local_29c0);
      local_2944 = DynamicList::Builder::size(&local_2980);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (0u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,&local_2940,&local_2944);
      DynamicValue::Builder::~Builder(&local_29c0);
      local_2939 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2a58,"boolList");
  DynamicStruct::Builder::get(&local_2a48,(Builder *)&stack0x00000008,(StringPtr)_auStack_2a58);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2a08,&local_2a48);
  uVar9 = DynamicList::Builder::size(&local_2a08);
  DynamicValue::Builder::~Builder(&local_2a48);
  if (uVar9 != 0) {
    local_2a59 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a59 != false) {
      local_2a60 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2af0,"boolList");
      DynamicStruct::Builder::get(&local_2ae0,(Builder *)&stack0x00000008,(StringPtr)local_2af0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2aa0,&local_2ae0);
      local_2a64 = DynamicList::Builder::size(&local_2aa0);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x242,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"boolList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"boolList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (0u) == (reader.get(\"boolList\").template as<DynamicList>().size())"
                 ,&local_2a60,&local_2a64);
      DynamicValue::Builder::~Builder(&local_2ae0);
      local_2a59 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2b78,"int8List");
  DynamicStruct::Builder::get(&local_2b68,(Builder *)&stack0x00000008,(StringPtr)_auStack_2b78);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2b28,&local_2b68);
  uVar9 = DynamicList::Builder::size(&local_2b28);
  DynamicValue::Builder::~Builder(&local_2b68);
  if (uVar9 != 0) {
    local_2b79 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b79 != false) {
      local_2b80 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2c10,"int8List");
      DynamicStruct::Builder::get(&local_2c00,(Builder *)&stack0x00000008,(StringPtr)local_2c10);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2bc0,&local_2c00);
      local_2b84 = DynamicList::Builder::size(&local_2bc0);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x243,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"int8List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int8List\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (0u) == (reader.get(\"int8List\").template as<DynamicList>().size())"
                 ,&local_2b80,&local_2b84);
      DynamicValue::Builder::~Builder(&local_2c00);
      local_2b79 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2c98,"int16List");
  DynamicStruct::Builder::get(&local_2c88,(Builder *)&stack0x00000008,(StringPtr)_auStack_2c98);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2c48,&local_2c88);
  uVar9 = DynamicList::Builder::size(&local_2c48);
  DynamicValue::Builder::~Builder(&local_2c88);
  if (uVar9 != 0) {
    local_2c99 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c99 != false) {
      local_2ca0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2d30,"int16List");
      DynamicStruct::Builder::get(&local_2d20,(Builder *)&stack0x00000008,(StringPtr)local_2d30);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2ce0,&local_2d20);
      local_2ca4 = DynamicList::Builder::size(&local_2ce0);
      kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x244,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"int16List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int16List\").template as<DynamicList>().size()"
                 ,(char (*) [85])
                  "failed: expected (0u) == (reader.get(\"int16List\").template as<DynamicList>().size())"
                 ,&local_2ca0,&local_2ca4);
      DynamicValue::Builder::~Builder(&local_2d20);
      local_2c99 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2db8,"int32List");
  DynamicStruct::Builder::get(&local_2da8,(Builder *)&stack0x00000008,(StringPtr)_auStack_2db8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2d68,&local_2da8);
  uVar9 = DynamicList::Builder::size(&local_2d68);
  DynamicValue::Builder::~Builder(&local_2da8);
  if (uVar9 != 0) {
    local_2db9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2db9 != false) {
      local_2dc0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2e50,"int32List");
      DynamicStruct::Builder::get(&local_2e40,(Builder *)&stack0x00000008,(StringPtr)local_2e50);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2e00,&local_2e40);
      local_2dc4 = DynamicList::Builder::size(&local_2e00);
      kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x245,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"int32List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int32List\").template as<DynamicList>().size()"
                 ,(char (*) [85])
                  "failed: expected (0u) == (reader.get(\"int32List\").template as<DynamicList>().size())"
                 ,&local_2dc0,&local_2dc4);
      DynamicValue::Builder::~Builder(&local_2e40);
      local_2db9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2ed8,"int64List");
  DynamicStruct::Builder::get(&local_2ec8,(Builder *)&stack0x00000008,(StringPtr)_auStack_2ed8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2e88,&local_2ec8);
  uVar9 = DynamicList::Builder::size(&local_2e88);
  DynamicValue::Builder::~Builder(&local_2ec8);
  if (uVar9 != 0) {
    local_2ed9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2ed9 != false) {
      local_2ee0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_2f70,"int64List");
      DynamicStruct::Builder::get(&local_2f60,(Builder *)&stack0x00000008,(StringPtr)local_2f70);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2f20,&local_2f60);
      local_2ee4 = DynamicList::Builder::size(&local_2f20);
      kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x246,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"int64List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int64List\").template as<DynamicList>().size()"
                 ,(char (*) [85])
                  "failed: expected (0u) == (reader.get(\"int64List\").template as<DynamicList>().size())"
                 ,&local_2ee0,&local_2ee4);
      DynamicValue::Builder::~Builder(&local_2f60);
      local_2ed9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2ff8,"uInt8List");
  DynamicStruct::Builder::get(&local_2fe8,(Builder *)&stack0x00000008,(StringPtr)_auStack_2ff8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2fa8,&local_2fe8);
  uVar9 = DynamicList::Builder::size(&local_2fa8);
  DynamicValue::Builder::~Builder(&local_2fe8);
  if (uVar9 != 0) {
    local_2ff9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2ff9 != false) {
      local_3000 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_3090,"uInt8List");
      DynamicStruct::Builder::get(&local_3080,(Builder *)&stack0x00000008,(StringPtr)local_3090);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3040,&local_3080);
      local_3004 = DynamicList::Builder::size(&local_3040);
      kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x247,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt8List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt8List\").template as<DynamicList>().size()"
                 ,(char (*) [85])
                  "failed: expected (0u) == (reader.get(\"uInt8List\").template as<DynamicList>().size())"
                 ,&local_3000,&local_3004);
      DynamicValue::Builder::~Builder(&local_3080);
      local_2ff9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3118,"uInt16List");
  DynamicStruct::Builder::get(&local_3108,(Builder *)&stack0x00000008,(StringPtr)_auStack_3118);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_30c8,&local_3108);
  uVar9 = DynamicList::Builder::size(&local_30c8);
  DynamicValue::Builder::~Builder(&local_3108);
  if (uVar9 != 0) {
    local_3119 = kj::_::Debug::shouldLog(ERROR);
    while (local_3119 != false) {
      local_3120 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_31b0,"uInt16List");
      DynamicStruct::Builder::get(&local_31a0,(Builder *)&stack0x00000008,(StringPtr)local_31b0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3160,&local_31a0);
      local_3124 = DynamicList::Builder::size(&local_3160);
      kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt16List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt16List\").template as<DynamicList>().size()"
                 ,(char (*) [86])
                  "failed: expected (0u) == (reader.get(\"uInt16List\").template as<DynamicList>().size())"
                 ,&local_3120,&local_3124);
      DynamicValue::Builder::~Builder(&local_31a0);
      local_3119 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3238,"uInt32List");
  DynamicStruct::Builder::get(&local_3228,(Builder *)&stack0x00000008,(StringPtr)_auStack_3238);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_31e8,&local_3228);
  uVar9 = DynamicList::Builder::size(&local_31e8);
  DynamicValue::Builder::~Builder(&local_3228);
  if (uVar9 != 0) {
    local_3239 = kj::_::Debug::shouldLog(ERROR);
    while (local_3239 != false) {
      local_3240 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_32d0,"uInt32List");
      DynamicStruct::Builder::get(&local_32c0,(Builder *)&stack0x00000008,(StringPtr)local_32d0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3280,&local_32c0);
      local_3244 = DynamicList::Builder::size(&local_3280);
      kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x249,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt32List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt32List\").template as<DynamicList>().size()"
                 ,(char (*) [86])
                  "failed: expected (0u) == (reader.get(\"uInt32List\").template as<DynamicList>().size())"
                 ,&local_3240,&local_3244);
      DynamicValue::Builder::~Builder(&local_32c0);
      local_3239 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3358,"uInt64List");
  DynamicStruct::Builder::get(&local_3348,(Builder *)&stack0x00000008,(StringPtr)_auStack_3358);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_3308,&local_3348);
  uVar9 = DynamicList::Builder::size(&local_3308);
  DynamicValue::Builder::~Builder(&local_3348);
  if (uVar9 != 0) {
    local_3359 = kj::_::Debug::shouldLog(ERROR);
    while (local_3359 != false) {
      local_3360 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_33f0,"uInt64List");
      DynamicStruct::Builder::get(&local_33e0,(Builder *)&stack0x00000008,(StringPtr)local_33f0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_33a0,&local_33e0);
      local_3364 = DynamicList::Builder::size(&local_33a0);
      kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x24a,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt64List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt64List\").template as<DynamicList>().size()"
                 ,(char (*) [86])
                  "failed: expected (0u) == (reader.get(\"uInt64List\").template as<DynamicList>().size())"
                 ,&local_3360,&local_3364);
      DynamicValue::Builder::~Builder(&local_33e0);
      local_3359 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3478,"float32List");
  DynamicStruct::Builder::get(&local_3468,(Builder *)&stack0x00000008,(StringPtr)_auStack_3478);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_3428,&local_3468);
  uVar9 = DynamicList::Builder::size(&local_3428);
  DynamicValue::Builder::~Builder(&local_3468);
  if (uVar9 != 0) {
    local_3479 = kj::_::Debug::shouldLog(ERROR);
    while (local_3479 != false) {
      local_3480 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_3510,"float32List");
      DynamicStruct::Builder::get(&local_3500,(Builder *)&stack0x00000008,(StringPtr)local_3510);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_34c0,&local_3500);
      local_3484 = DynamicList::Builder::size(&local_34c0);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x24b,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"float32List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"float32List\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (reader.get(\"float32List\").template as<DynamicList>().size())"
                 ,&local_3480,&local_3484);
      DynamicValue::Builder::~Builder(&local_3500);
      local_3479 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3598,"float64List");
  DynamicStruct::Builder::get(&local_3588,(Builder *)&stack0x00000008,(StringPtr)_auStack_3598);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_3548,&local_3588);
  uVar9 = DynamicList::Builder::size(&local_3548);
  DynamicValue::Builder::~Builder(&local_3588);
  if (uVar9 != 0) {
    local_3599 = kj::_::Debug::shouldLog(ERROR);
    while (local_3599 != false) {
      local_35a0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_3630,"float64List");
      DynamicStruct::Builder::get(&local_3620,(Builder *)&stack0x00000008,(StringPtr)local_3630);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_35e0,&local_3620);
      local_35a4 = DynamicList::Builder::size(&local_35e0);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x24c,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"float64List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"float64List\").template as<DynamicList>().size()"
                 ,(char (*) [87])
                  "failed: expected (0u) == (reader.get(\"float64List\").template as<DynamicList>().size())"
                 ,&local_35a0,&local_35a4);
      DynamicValue::Builder::~Builder(&local_3620);
      local_3599 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_36b8,"textList");
  DynamicStruct::Builder::get(&local_36a8,(Builder *)&stack0x00000008,(StringPtr)_auStack_36b8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_3668,&local_36a8);
  uVar9 = DynamicList::Builder::size(&local_3668);
  DynamicValue::Builder::~Builder(&local_36a8);
  if (uVar9 != 0) {
    local_36b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_36b9 != false) {
      local_36c0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_3750,"textList");
      DynamicStruct::Builder::get(&local_3740,(Builder *)&stack0x00000008,(StringPtr)local_3750);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3700,&local_3740);
      local_36c4 = DynamicList::Builder::size(&local_3700);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x24d,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"textList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"textList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (0u) == (reader.get(\"textList\").template as<DynamicList>().size())"
                 ,&local_36c0,&local_36c4);
      DynamicValue::Builder::~Builder(&local_3740);
      local_36b9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_37d8,"dataList");
  DynamicStruct::Builder::get(&local_37c8,(Builder *)&stack0x00000008,(StringPtr)_auStack_37d8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_3788,&local_37c8);
  uVar9 = DynamicList::Builder::size(&local_3788);
  DynamicValue::Builder::~Builder(&local_37c8);
  if (uVar9 != 0) {
    local_37d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_37d9 != false) {
      local_37e0 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_3870,"dataList");
      DynamicStruct::Builder::get(&local_3860,(Builder *)&stack0x00000008,(StringPtr)local_3870);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3820,&local_3860);
      local_37e4 = DynamicList::Builder::size(&local_3820);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x24e,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"dataList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"dataList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (0u) == (reader.get(\"dataList\").template as<DynamicList>().size())"
                 ,&local_37e0,&local_37e4);
      DynamicValue::Builder::~Builder(&local_3860);
      local_37d9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_38f8,"structList");
  DynamicStruct::Builder::get(&local_38e8,(Builder *)&stack0x00000008,(StringPtr)_auStack_38f8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_38a8,&local_38e8);
  uVar9 = DynamicList::Builder::size(&local_38a8);
  DynamicValue::Builder::~Builder(&local_38e8);
  if (uVar9 != 0) {
    local_38f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_38f9 != false) {
      local_3900 = 0;
      kj::StringPtr::StringPtr((StringPtr *)&local_3990,"structList");
      DynamicStruct::Builder::get(&local_3980,(Builder *)&stack0x00000008,(StringPtr)local_3990);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_3940,&local_3980);
      local_3904 = DynamicList::Builder::size(&local_3940);
      kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x24f,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.get(\\\"structList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"structList\").template as<DynamicList>().size()"
                 ,(char (*) [86])
                  "failed: expected (0u) == (reader.get(\"structList\").template as<DynamicList>().size())"
                 ,&local_3900,&local_3904);
      DynamicValue::Builder::~Builder(&local_3980);
      local_38f9 = false;
    }
  }
  return;
}

Assistant:

void dynamicCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(false, reader.get("boolField").as<bool>());
  EXPECT_EQ(0, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(0, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(0, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(0, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(0u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(0u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(0u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(0u, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(0, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(0, reader.get("float64Field").as<double>());
  EXPECT_EQ("", reader.get("textField").as<Text>());
  EXPECT_EQ(data(""), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(false, subReader.get("boolField").as<bool>());
    EXPECT_EQ(0, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(0, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(0, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(0, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(0u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(0u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(0u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(0u, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(0, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(0, subReader.get("float64Field").as<double>());
    EXPECT_EQ("", subReader.get("textField").as<Text>());
    EXPECT_EQ(data(""), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("", subSubReader.get("structField").as<DynamicStruct>()
                                .get("textField").as<Text>());
    }

    EXPECT_EQ(0u, subReader.get("voidList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("boolList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int8List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int16List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt8List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt16List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("float32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("float64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("textList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("dataList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("structList").as<DynamicList>().size());
  }

  EXPECT_EQ(0u, reader.get("voidList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("boolList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int8List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int16List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt8List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt16List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("float32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("float64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("textList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("dataList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("structList").as<DynamicList>().size());
}